

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Parser
cm_expat_XML_ExternalEntityParserCreate
          (XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *newTable;
  STRING_POOL *newPool;
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  XML_Parser pvVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long *parser;
  XML_Char *pXVar26;
  NAMED *pNVar27;
  undefined1 *puVar28;
  NAMED *pNVar29;
  KEY pXVar30;
  long *plVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long *plVar35;
  XML_Char tmp [2];
  XML_Char local_168 [312];
  
  lVar7 = *(long *)((long)oldParser + 0x68);
  lVar8 = *(long *)((long)oldParser + 0x70);
  lVar9 = *(long *)((long)oldParser + 0x78);
  lVar10 = *(long *)((long)oldParser + 0x80);
  lVar11 = *(long *)((long)oldParser + 0x88);
  lVar12 = *(long *)((long)oldParser + 0x90);
  lVar13 = *(long *)((long)oldParser + 0x98);
  lVar14 = *(long *)((long)oldParser + 0xa0);
  lVar15 = *(long *)((long)oldParser + 0xb8);
  lVar16 = *(long *)((long)oldParser + 0xc0);
  lVar17 = *(long *)((long)oldParser + 200);
  lVar18 = *(long *)((long)oldParser + 0xd0);
  lVar19 = *(long *)((long)oldParser + 0xd8);
  lVar20 = *(long *)((long)oldParser + 0xe0);
  lVar21 = *(long *)((long)oldParser + 0xf0);
  lVar22 = *(long *)((long)oldParser + 0xf8);
  lVar23 = *(long *)((long)oldParser + 0x100);
  lVar24 = *(long *)((long)oldParser + 0x108);
  lVar32 = *(long *)((long)oldParser + 0x110);
  lVar34 = *(long *)((long)oldParser + 0x278);
  plVar35 = *oldParser;
  lVar33 = *(long *)((long)oldParser + 8);
  uVar1 = *(undefined4 *)((long)oldParser + 0x238);
  pvVar4 = *(XML_Parser *)((long)oldParser + 0xe8);
  uVar2 = *(undefined4 *)((long)oldParser + 0x48c);
  uVar3 = *(undefined4 *)((long)oldParser + 0x1cc);
  if (*(int *)((long)oldParser + 0x1c8) == 0) {
    pXVar26 = (XML_Char *)0x0;
  }
  else {
    local_168[0] = *(XML_Char *)((long)oldParser + 0x488);
    pXVar26 = local_168;
  }
  parser = (long *)cm_expat_XML_ParserCreate_MM
                             (encodingName,(XML_Memory_Handling_Suite *)((long)oldParser + 0x18),
                              pXVar26);
  if (parser != (long *)0x0) {
    parser[0xd] = lVar7;
    parser[0xe] = lVar8;
    parser[0xf] = lVar9;
    parser[0x10] = lVar10;
    parser[0x11] = lVar11;
    parser[0x12] = lVar12;
    parser[0x13] = lVar13;
    parser[0x14] = lVar14;
    parser[0x17] = lVar15;
    parser[0x18] = lVar16;
    parser[0x19] = lVar17;
    parser[0x1a] = lVar18;
    parser[0x1b] = lVar19;
    parser[0x1c] = lVar20;
    parser[0x1e] = lVar21;
    parser[0x1f] = lVar22;
    parser[0x20] = lVar23;
    parser[0x21] = lVar24;
    parser[0x22] = lVar32;
    parser[0x4f] = lVar34;
    *parser = (long)plVar35;
    if (plVar35 != (long *)lVar33) {
      plVar35 = parser;
    }
    parser[1] = (long)plVar35;
    if (pvVar4 != oldParser) {
      parser[0x1d] = (long)pvVar4;
    }
    *(undefined4 *)(parser + 0x47) = uVar1;
    *(undefined4 *)((long)parser + 0x1cc) = uVar3;
    *(undefined4 *)((long)parser + 0x48c) = uVar2;
    newTable = (HASH_TABLE *)(parser + 0x52);
    if (context == (XML_Char *)0x0) {
      memcpy(local_168,newTable,0x138);
      memcpy(newTable,(void *)((long)oldParser + 0x290),0x138);
      memcpy((void *)((long)oldParser + 0x290),local_168,0x138);
      parser[0x92] = (long)oldParser;
      cm_expat_XmlPrologStateInitExternalEntity((PROLOG_STATE *)(parser + 0x3e));
      *(undefined4 *)(parser + 0x6c) = 1;
      *(undefined4 *)((long)parser + 0x484) = 1;
      return parser;
    }
    lVar32 = *(long *)((long)oldParser + 0x308);
    lVar34 = *(long *)((long)oldParser + 0x310);
    newPool = (STRING_POOL *)(parser + 0x66);
    table = (HASH_TABLE *)(parser + 0x61);
    for (lVar33 = 0; lVar34 << 3 != lVar33; lVar33 = lVar33 + 8) {
      puVar5 = *(undefined8 **)(lVar32 + lVar33);
      if ((puVar5 != (undefined8 *)0x0) &&
         ((pXVar26 = poolCopyString(newPool,(XML_Char *)*puVar5), pXVar26 == (XML_Char *)0x0 ||
          (pNVar27 = lookup(table,pXVar26,0x10), pNVar27 == (NAMED *)0x0)))) goto LAB_0014d2f5;
    }
    lVar32 = *(long *)((long)oldParser + 0x2e0);
    lVar34 = *(long *)((long)oldParser + 0x2e8);
    table_00 = (HASH_TABLE *)(parser + 0x5c);
    for (lVar33 = 0; lVar34 << 3 != lVar33; lVar33 = lVar33 + 8) {
      puVar5 = *(undefined8 **)(lVar32 + lVar33);
      if (puVar5 != (undefined8 *)0x0) {
        puVar28 = (undefined1 *)parser[0x69];
        if (puVar28 == (undefined1 *)parser[0x68]) {
          iVar25 = poolGrow(newPool);
          if (iVar25 == 0) goto LAB_0014d2f5;
          puVar28 = (undefined1 *)parser[0x69];
        }
        parser[0x69] = (long)(puVar28 + 1);
        *puVar28 = 0;
        pXVar26 = poolCopyString(newPool,(XML_Char *)*puVar5);
        if ((pXVar26 == (XML_Char *)0x0) ||
           (pNVar27 = lookup(table_00,pXVar26 + 1,0x18), pNVar27 == (NAMED *)0x0))
        goto LAB_0014d2f5;
        *(undefined1 *)&pNVar27[2].name = *(undefined1 *)(puVar5 + 2);
        puVar6 = (undefined8 *)puVar5[1];
        if (puVar6 != (undefined8 *)0x0) {
          *(undefined1 *)((long)&pNVar27[2].name + 1) = *(undefined1 *)((long)puVar5 + 0x11);
          pNVar29 = (NAMED *)(parser + 0x72);
          if (puVar6 != (undefined8 *)((long)oldParser + 0x390)) {
            pNVar29 = lookup(table,(KEY)*puVar6,0);
          }
          pNVar27[1].name = (KEY)pNVar29;
        }
      }
    }
    plVar31 = *(long **)((long)oldParser + 0x2b8);
    plVar35 = plVar31 + *(long *)((long)oldParser + 0x2c0);
    while (plVar31 != plVar35) {
      puVar5 = (undefined8 *)*plVar31;
      plVar31 = plVar31 + 1;
      if (puVar5 != (undefined8 *)0x0) {
        pXVar26 = poolCopyString(newPool,(XML_Char *)*puVar5);
        if ((pXVar26 == (XML_Char *)0x0) ||
           (pNVar27 = lookup((HASH_TABLE *)(parser + 0x57),pXVar26,0x28), pNVar27 == (NAMED *)0x0))
        goto LAB_0014d2f5;
        if ((long)*(int *)(puVar5 + 3) != 0) {
          pXVar30 = (KEY)(*(code *)parser[3])((long)*(int *)(puVar5 + 3) * 0x18);
          pNVar27[4].name = pXVar30;
          if (pXVar30 == (KEY)0x0) goto LAB_0014d2f5;
        }
        if ((undefined8 *)puVar5[2] != (undefined8 *)0x0) {
          pNVar29 = lookup(table_00,*(KEY *)puVar5[2],0);
          pNVar27[2].name = (KEY)pNVar29;
        }
        iVar25 = *(int *)(puVar5 + 3);
        *(int *)&pNVar27[3].name = iVar25;
        *(int *)((long)&pNVar27[3].name + 4) = iVar25;
        if ((undefined8 *)puVar5[1] != (undefined8 *)0x0) {
          pNVar29 = lookup(table,*(KEY *)puVar5[1],0);
          pNVar27[1].name = (KEY)pNVar29;
          iVar25 = *(int *)&pNVar27[3].name;
        }
        if (0 < iVar25) {
          lVar32 = 0;
          lVar34 = 0;
          do {
            pNVar29 = lookup(table_00,(KEY)**(undefined8 **)(puVar5[4] + lVar32),0);
            pXVar30 = pNVar27[4].name;
            *(NAMED **)(pXVar30 + lVar32) = pNVar29;
            lVar33 = puVar5[4];
            pXVar30[lVar32 + 8] = *(XML_Char *)(lVar33 + 8 + lVar32);
            pXVar26 = *(XML_Char **)(lVar33 + 0x10 + lVar32);
            if (pXVar26 == (XML_Char *)0x0) {
              pXVar30 = pXVar30 + lVar32 + 0x10;
              pXVar30[0] = '\0';
              pXVar30[1] = '\0';
              pXVar30[2] = '\0';
              pXVar30[3] = '\0';
              pXVar30[4] = '\0';
              pXVar30[5] = '\0';
              pXVar30[6] = '\0';
              pXVar30[7] = '\0';
            }
            else {
              pXVar26 = poolCopyString(newPool,pXVar26);
              *(XML_Char **)(pNVar27[4].name + lVar32 + 0x10) = pXVar26;
              if (pXVar26 == (XML_Char *)0x0) goto LAB_0014d2f5;
            }
            lVar34 = lVar34 + 1;
            lVar32 = lVar32 + 0x18;
          } while (lVar34 < *(int *)&pNVar27[3].name);
        }
      }
    }
    iVar25 = copyEntityTable(newTable,newPool,*(HASH_TABLE **)((long)oldParser + 0x290),
                             *(XML_Parser *)((long)oldParser + 0x298));
    if ((iVar25 != 0) &&
       (iVar25 = copyEntityTable((HASH_TABLE *)(parser + 0x6d),newPool,
                                 *(HASH_TABLE **)((long)oldParser + 0x368),
                                 *(XML_Parser *)((long)oldParser + 0x370)), iVar25 != 0)) {
      parser[0x6c] = *(long *)((long)oldParser + 0x360);
      *(undefined4 *)(parser + 0x74) = *(undefined4 *)((long)oldParser + 0x3a0);
      parser[0x75] = *(long *)((long)oldParser + 0x3a8);
      parser[0x76] = *(long *)((long)oldParser + 0x3b0);
      *(undefined4 *)((long)parser + 0x3bc) = *(undefined4 *)((long)oldParser + 0x3bc);
      parser[0x78] = *(long *)((long)oldParser + 0x3c0);
      iVar25 = setContext(parser,context);
      if (iVar25 != 0) {
        parser[0x41] = (long)externalEntityInitProcessor;
        return parser;
      }
    }
LAB_0014d2f5:
    cm_expat_XML_ParserFree(parser);
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XML_ExternalEntityParserCreate(XML_Parser oldParser,
                                          const XML_Char *context,
                                          const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *oldDtd = &dtd;
  XML_StartElementHandler oldStartElementHandler = startElementHandler;
  XML_EndElementHandler oldEndElementHandler = endElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler = characterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler = processingInstructionHandler;
  XML_CommentHandler oldCommentHandler = commentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler = startCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler = endCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler = defaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler = unparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler = notationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler = startNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler = endNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler = notStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler = externalEntityRefHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler = unknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler = elementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler = attlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler = entityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler = xmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType = declElementType;

  void *oldUserData = userData;
  void *oldHandlerArg = handlerArg;
  int oldDefaultExpandInternalEntities = defaultExpandInternalEntities;
  void *oldExternalEntityRefHandlerArg = externalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing = paramEntityParsing;
#endif
  int oldns_triplets = ns_triplets;

  if (ns) {
    XML_Char tmp[2];

    *tmp = namespaceSeparator;
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 tmp);
  }
  else {
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 NULL);
  }

  if (!parser)
    return 0;

  startElementHandler = oldStartElementHandler;
  endElementHandler = oldEndElementHandler;
  characterDataHandler = oldCharacterDataHandler;
  processingInstructionHandler = oldProcessingInstructionHandler;
  commentHandler = oldCommentHandler;
  startCdataSectionHandler = oldStartCdataSectionHandler;
  endCdataSectionHandler = oldEndCdataSectionHandler;
  defaultHandler = oldDefaultHandler;
  unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  notationDeclHandler = oldNotationDeclHandler;
  startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  notStandaloneHandler = oldNotStandaloneHandler;
  externalEntityRefHandler = oldExternalEntityRefHandler;
  unknownEncodingHandler = oldUnknownEncodingHandler;
  elementDeclHandler = oldElementDeclHandler;
  attlistDeclHandler = oldAttlistDeclHandler;
  entityDeclHandler = oldEntityDeclHandler;
  xmlDeclHandler = oldXmlDeclHandler;
  declElementType = oldDeclElementType;
  userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    handlerArg = userData;
  else
    handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  ns_triplets = oldns_triplets;
#ifdef XML_DTD
  paramEntityParsing = oldParamEntityParsing;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(&dtd, oldDtd, parser) || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return 0;
    }
    processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    dtdSwap(&dtd, oldDtd);
    parentParser = oldParser;
    XmlPrologStateInitExternalEntity(&prologState);
    dtd.complete = 1;
    hadExternalDoctype = 1;
  }
#endif /* XML_DTD */
  return parser;
}